

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hudmessages.cpp
# Opt level: O1

void __thiscall DHUDMessage::Draw(DHUDMessage *this,int bottom,int visibility)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  float fVar10;
  float intpart;
  uint local_40;
  int local_3c;
  int local_38;
  float local_34;
  
  if ((this->VisibilityFlags & visibility) != 0) {
    return;
  }
  (*(this->super_DObject)._vptr_DObject[8])();
  iVar9 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
  iVar2 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
  if (this->HUDWidth == 0) {
    iVar1 = active_con_scaletext();
    if (iVar1 == 0) {
      local_3c = CleanXfac;
      local_38 = CleanYfac;
      uVar6 = 1;
      goto LAB_004beef7;
    }
  }
  local_38 = 1;
  if (this->HUDWidth == 0) {
    iVar1 = active_con_scaletext();
    iVar9 = iVar9 / iVar1;
    iVar1 = active_con_scaletext();
    iVar2 = iVar2 / iVar1;
    iVar1 = active_con_scaletext();
    bottom = bottom / iVar1;
    uVar6 = 0;
    local_3c = 1;
  }
  else {
    uVar6 = 0;
    local_3c = 1;
  }
LAB_004beef7:
  if (this->HUDWidth == 0) {
    fVar10 = this->Left;
    if (fVar10 <= 0.0) {
      fVar10 = -fVar10;
    }
    else {
      iVar9 = iVar9 - this->Width * local_3c;
    }
    local_40 = (uint)(fVar10 * (float)iVar9);
    fVar10 = this->Top;
    if (fVar10 <= 0.0) {
      fVar10 = -fVar10;
      iVar9 = bottom;
    }
    else {
      iVar9 = bottom - this->Height * local_38;
    }
    uVar3 = (uint)(fVar10 * (float)iVar9);
  }
  else {
    fVar10 = modff(this->Left,&local_34);
    local_40 = (uint)local_34;
    uVar3 = (int)(ABS(fVar10) * 10.0 + 0.5) & 3;
    if (uVar3 == 2) {
      local_40 = local_40 - this->Width;
    }
    else if (uVar3 == 0) {
      local_40 = local_40 - this->Width / 2;
    }
    fVar10 = modff(this->Top,&local_34);
    uVar3 = (uint)local_34;
    uVar4 = (int)(ABS(fVar10) * 10.0 + 0.5) & 3;
    if (uVar4 == 2) {
      uVar3 = uVar3 - this->Height;
    }
    else if (uVar4 == 0) {
      uVar3 = uVar3 - this->Height / 2;
    }
  }
  if (this->CenterX == true) {
    local_40 = local_40 + (this->Width * local_3c) / 2;
  }
  iVar9 = this->Font->FontHeight;
  iVar1 = this->HUDHeight;
  if ((long)iVar1 < 0) {
    uVar5 = (ulong)(uint)-iVar1;
  }
  else {
    uVar5 = ((long)iVar1 * (long)iVar2) / (long)bottom;
  }
  CalcClipCoords(this,(int)uVar5);
  if (0 < this->NumLines) {
    lVar7 = 0;
    uVar8 = 0;
    do {
      uVar4 = local_40;
      if (this->CenterX == true) {
        uVar4 = local_40 - (*(int *)((long)&this->Lines->Width + lVar7) * local_3c) / 2;
      }
      (*(this->super_DObject)._vptr_DObject[9])
                (this,uVar8 & 0xffffffff,(ulong)uVar4,(ulong)uVar3,uVar6,uVar5 & 0xffffffff);
      uVar3 = uVar3 + local_38 * iVar9;
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x10;
    } while ((long)uVar8 < (long)this->NumLines);
  }
  return;
}

Assistant:

void DHUDMessage::Draw (int bottom, int visibility)
{
	int xscale, yscale;
	int x, y;
	int ystep;
	int i;
	bool clean = false;
	int hudheight;

	// If any of the visibility flags match, do NOT draw this message.
	if (VisibilityFlags & visibility)
	{
		return;
	}

	DrawSetup ();

	int screen_width = SCREENWIDTH;
	int screen_height = SCREENHEIGHT;
	if (HUDWidth == 0 && active_con_scaletext() == 0)
	{
		clean = true;
		xscale = CleanXfac;
		yscale = CleanYfac;
	}
	else
	{
		xscale = yscale = 1;
		if (HUDWidth == 0)
		{
			screen_width /= active_con_scaletext();
			screen_height /= active_con_scaletext();
			bottom /= active_con_scaletext();
		}
	}

	if (HUDWidth == 0)
	{
		if (Left > 0.f)
		{ // Position center
			x = (int)((float)(screen_width - Width * xscale) * Left);
		}
		else
		{ // Position edge
			x = (int)((float)screen_width * -Left);
		}
		if (Top > 0.f)
		{ // Position center
			y = (int)((float)(bottom - Height * yscale) * Top);
		}
		else
		{ // Position edge
			y = (int)((float)bottom * -Top);
		}
	}
	else
	{
		float intpart;
		int fracpart;

		fracpart = (int)(fabsf (modff (Left, &intpart)) * 10.f + 0.5f);
		x = (int)intpart;
		switch (fracpart & 3)
		{
		case 0: // Position center
			x -= Width / 2;
			break;

		case 2: // Position right
			x -= Width;
			break;
		}

		fracpart = (int)(fabsf (modff (Top, &intpart)) * 10.f + 0.5f);
		y = (int)intpart;
		switch (fracpart & 3)
		{
		case 0: // Position center
			y -= Height / 2;
			break;

		case 2: // Position bottom
			y -= Height;
			break;
		}
	}

	if (CenterX)
	{
		x += Width * xscale / 2;
	}

	ystep = Font->GetHeight() * yscale;

	if (HUDHeight < 0)
	{ // A negative height means the HUD size covers the status bar
		hudheight = -HUDHeight;
	}
	else
	{ // A positive height means the HUD size does not cover the status bar
		hudheight = Scale (HUDHeight, screen_height, bottom);
	}
	CalcClipCoords(hudheight);

	for (i = 0; i < NumLines; i++)
	{
		int drawx;

		drawx = CenterX ? x - Lines[i].Width*xscale/2 : x;
		DoDraw (i, drawx, y, clean, hudheight);
		y += ystep;
	}
}